

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

StringRef __thiscall
mp::internal::TextReader<fmt::Locale>::ReadString(TextReader<fmt::Locale> *this)

{
  long lVar1;
  CStringRef format_str;
  CStringRef format_str_00;
  CStringRef format_str_01;
  int iVar2;
  long *in_RDI;
  char c;
  int i;
  char *start;
  int length;
  char *local_a0;
  ArgList local_78;
  BasicCStringRef<char> local_68;
  ArgList local_60;
  BasicCStringRef<char> local_50;
  char local_45;
  int local_44;
  char *local_40;
  ArgList *in_stack_ffffffffffffffc8;
  anon_union_8_2_de49483c_for_ArgList_1 in_stack_ffffffffffffffd0;
  BasicCStringRef<char> in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  StringRef local_10;
  
  iVar2 = ReadUInt((TextReader<fmt::Locale> *)0x1679d1);
  if (*(char *)*in_RDI != ':') {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffd8,"expected \':\'");
    fmt::ArgList::ArgList((ArgList *)&stack0xffffffffffffffc8);
    format_str.data_._4_4_ = iVar2;
    format_str.data_._0_4_ = in_stack_ffffffffffffffe0;
    DoReportError((TextReader<fmt::Locale> *)in_stack_ffffffffffffffd8.data_,
                  (char *)in_stack_ffffffffffffffd0.values_,format_str,in_stack_ffffffffffffffc8);
  }
  *in_RDI = *in_RDI + 1;
  local_40 = (char *)*in_RDI;
  local_44 = 0;
  while (local_44 < iVar2) {
    local_45 = *(char *)*in_RDI;
    if (local_45 == '\n') {
      in_RDI[8] = *in_RDI + 1;
      *(int *)(in_RDI + 9) = (int)in_RDI[9] + 1;
    }
    else if ((local_45 == '\0') && (*in_RDI == in_RDI[2])) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"unexpected end of file in string");
      fmt::ArgList::ArgList(&local_60);
      format_str_00.data_._4_4_ = iVar2;
      format_str_00.data_._0_4_ = in_stack_ffffffffffffffe0;
      DoReportError((TextReader<fmt::Locale> *)in_stack_ffffffffffffffd8.data_,
                    (char *)in_stack_ffffffffffffffd0.values_,format_str_00,
                    in_stack_ffffffffffffffc8);
    }
    local_44 = local_44 + 1;
    *in_RDI = *in_RDI + 1;
  }
  if (*(char *)*in_RDI != '\n') {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_68,"expected newline");
    fmt::ArgList::ArgList(&local_78);
    format_str_01.data_._4_4_ = iVar2;
    format_str_01.data_._0_4_ = in_stack_ffffffffffffffe0;
    DoReportError((TextReader<fmt::Locale> *)in_stack_ffffffffffffffd8.data_,
                  (char *)in_stack_ffffffffffffffd0.values_,format_str_01,in_stack_ffffffffffffffc8)
    ;
  }
  *(int *)(in_RDI + 9) = (int)in_RDI[9] + 1;
  lVar1 = *in_RDI;
  *in_RDI = lVar1 + 1;
  in_RDI[8] = lVar1 + 1;
  if (iVar2 == 0) {
    local_a0 = (char *)0x0;
  }
  else {
    local_a0 = local_40;
  }
  fmt::BasicStringRef<char>::BasicStringRef(&local_10,local_a0,(long)iVar2);
  return local_10;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadString() {
  int length = ReadUInt();
  if (*ptr_ != ':')
    DoReportError(ptr_, "expected ':'");
  ++ptr_;
  const char *start = ptr_;
  for (int i = 0; i < length; ++i, ++ptr_) {
    char c = *ptr_;
    if (c == '\n') {
      line_start_ = ptr_  + 1;
      ++line_;
    } else if (!c && ptr_ == end_) {
      DoReportError(ptr_, "unexpected end of file in string");
    }
  }
  if (*ptr_ != '\n')
    DoReportError(ptr_, "expected newline");
  ++line_;
  line_start_ = ++ptr_;
  return fmt::StringRef(length != 0 ? start : 0, length);
}